

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VgaDebugGenerator.cpp
# Opt level: O3

void __thiscall
VgaDebugGenerator::Generate_Declaration(VgaDebugGenerator *this,Module *module,ofstream *fout)

{
  pointer pWVar1;
  ostream *poVar2;
  Wire *wire;
  pointer pWVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\n\n`define VGA_DBG_",0x12);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,(module->name)._M_dataplus._M_p,
                      (module->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"_Declaration",0xc);
  pWVar1 = (module->wires).super__Vector_base<Wire,_std::allocator<Wire>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pWVar3 = (module->wires).super__Vector_base<Wire,_std::allocator<Wire>_>._M_impl.
                super__Vector_impl_data._M_start; pWVar3 != pWVar1; pWVar3 = pWVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout," \\\n    wire ",0xc);
    if (1 < pWVar3->len_bits) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"[",1);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)fout,pWVar3->len_bits + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":0] ",4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"dbg_",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)fout,(pWVar3->full_name)._M_dataplus._M_p,
                        (pWVar3->full_name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,";",1);
  }
  return;
}

Assistant:

void VgaDebugGenerator::Generate_Declaration(const Module &module, std::ofstream &fout) {
    fout << "\n\n`define VGA_DBG_" << module.name << "_Declaration";
    for (const auto &wire : module.wires) {
        fout << " \\\n    wire ";
        if (wire.len_bits > 1) {
            fout << "[" << wire.len_bits - 1 << ":0] ";
        }
        fout << "dbg_" << wire.full_name << ";";
    }
}